

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIsComplete.cpp
# Opt level: O0

void testIsComplete(string *tempDir)

{
  ostream *poVar1;
  char *pcVar2;
  exception *e;
  string ict;
  string ct;
  string icsl;
  string csl;
  char *in_stack_000000f0;
  char *in_stack_000000f8;
  char *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing isComplete() function");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_110c17::writeFiles
            ((char *)csl._0_8_,(char *)icsl.field_2._8_8_,(char *)icsl.field_2._M_allocated_capacity
             ,(char *)icsl._M_string_length,icsl._4_4_,icsl._0_4_,
             csl.field_2._M_allocated_capacity._0_4_,csl.field_2._8_4_);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_110c17::checkFiles
            ((char *)tempDir,in_stack_000000f8,in_stack_000000f0,
             (char *)CONCAT44(csl.field_2._12_4_,csl.field_2._8_4_));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testIsComplete (const std::string &tempDir)
{
    try
    {
	cout << "Testing isComplete() function" << endl;

	std::string csl = tempDir + "imf_test_complete_sl.exr";
	std::string icsl = tempDir + "imf_test_incomplete_sl.exr";
	std::string ct = tempDir + "imf_test_complete_t.exr";
	std::string ict = tempDir + "imf_test_incomplete_t.exr";

	writeFiles (csl.c_str(), icsl.c_str(), ct.c_str(), ict.c_str(), 327, 289, 17, 17);
	checkFiles (csl.c_str(), icsl.c_str(), ct.c_str(), ict.c_str());

	remove (csl.c_str());
	remove (icsl.c_str());
	remove (ct.c_str());
	remove (ict.c_str());

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}